

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

void __thiscall Engine::set_assumptions(Engine *this,vec<BoolView> *xs)

{
  vec<int> *this_00;
  undefined8 in_RAX;
  ulong uVar1;
  long lVar2;
  undefined8 local_38;
  
  this_00 = &this->assumptions;
  if ((this->assumptions).data != (int *)0x0) {
    this_00->sz = 0;
  }
  local_38 = in_RAX;
  if (xs->sz != 0) {
    lVar2 = 0xc;
    uVar1 = 0;
    do {
      local_38 = CONCAT44(local_38._4_4_,
                          (uint)*(byte *)((long)&(xs->data->super_Var).super_Branching.
                                                 _vptr_Branching + lVar2) +
                          *(int *)((long)xs->data + lVar2 + -4) * 2);
      vec<int>::push(this_00,(int *)&local_38);
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar1 < xs->sz);
  }
  if (this->opt_var != (IntVar *)0x0) {
    local_38 = CONCAT44(::lit_True.x,(int)local_38);
    vec<int>::push(this_00,(int *)((long)&local_38 + 4));
  }
  return;
}

Assistant:

void Engine::set_assumptions(vec<BoolView>& xs) {
	// Push the assumptions, then search as usual.
	assumptions.clear();
	for (unsigned int li = 0; li < xs.size(); li++) {
		assumptions.push(toInt(xs[li].getLit(true)));
	}
	// constrain will overwrite the last assumption;
	// make sure there is a placeholder to overwrite.
	if (opt_var != nullptr) {
		assumptions.push(toInt(lit_True));
	}
}